

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCss::Selector>::clear(QList<QCss::Selector> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QCss::Selector> *this_00;
  __off_t __length;
  QArrayDataPointer<QCss::Selector> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QCss::Selector> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QCss::Selector> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QCss::Selector> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QCss::Selector>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QCss::Selector>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QCss::Selector> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QCss::Selector>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QCss::Selector>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QCss::Selector>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QCss::Selector>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QCss::Selector> *)
                QArrayDataPointer<QCss::Selector>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QCss::Selector>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }